

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleDisplay::relations(QAccessibleDisplay *this,Relation match)

{
  Int IVar1;
  QLabel *pQVar2;
  QWidget *pQVar3;
  long lVar4;
  long *in_RSI;
  QLabel *in_RDI;
  long in_FS_OFFSET;
  QLabel *label;
  QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *rels;
  QAccessibleInterface *iface;
  Relation rel;
  Relation in_stack_0000010c;
  QLabel *this_00;
  QFlagsStorageHelper<QAccessible::RelationFlag,_4> local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(Data **)&(in_RDI->super_QFrame).super_QWidget = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> **)
   &(in_RDI->super_QFrame).super_QWidget.field_0x8 =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QFrame).super_QWidget.super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QAccessibleWidget::relations((QAccessibleWidget *)rels,in_stack_0000010c);
  local_14.super_QFlagsStorage<QAccessible::RelationFlag>.i =
       (QFlagsStorage<QAccessible::RelationFlag>)
       QFlags<QAccessible::RelationFlag>::operator&
                 ((QFlags<QAccessible::RelationFlag> *)this_00,(RelationFlag)((ulong)in_RDI >> 0x20)
                 );
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  if (IVar1 != 0) {
    (**(code **)(*in_RSI + 0x18))();
    pQVar2 = qobject_cast<QLabel*>((QObject *)0x7ef4f5);
    if (pQVar2 != (QLabel *)0x0) {
      QFlags<QAccessible::RelationFlag>::QFlags
                ((QFlags<QAccessible::RelationFlag> *)this_00,(RelationFlag)((ulong)in_RDI >> 0x20))
      ;
      pQVar3 = QLabel::buddy(this_00);
      lVar4 = QAccessible::queryAccessibleInterface(&pQVar3->super_QObject);
      if (lVar4 != 0) {
        QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
        emplace_back<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                  ((QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)
                   this_00,(QAccessibleInterface **)in_RDI,
                   (QFlags<QAccessible::RelationFlag> *)0x7ef54d);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleDisplay::relations(QAccessible::Relation match /* = QAccessible::AllRelations */) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels =
            QAccessibleWidget::relations(match);
#    if QT_CONFIG(shortcut) && QT_CONFIG(label)
    if (match & QAccessible::Labelled) {
        if (QLabel *label = qobject_cast<QLabel*>(object())) {
            const QAccessible::Relation rel = QAccessible::Labelled;
            if (QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(label->buddy()))
                rels.emplace_back(iface, rel);
        }
    }
#endif
    return rels;
}